

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

bool __thiscall glslang::TParseContext::isRuntimeLength(TParseContext *this,TIntermTyped *base)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  undefined4 extraout_var_00;
  long *plVar4;
  long *plVar5;
  TType *this_00;
  TTypeList *pTVar6;
  
  iVar1 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
  lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x58))
                    ((long *)CONCAT44(extraout_var,iVar1));
  if ((*(uint *)(lVar3 + 8) & 0x7f) == 6) {
    iVar1 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x14])(base);
    plVar5 = (long *)CONCAT44(extraout_var_00,iVar1);
    if ((plVar5 != (long *)0x0) && ((int)plVar5[0x17] == 0x35)) {
      plVar4 = (long *)(**(code **)(*plVar5 + 0x198))(plVar5);
      lVar3 = (**(code **)(*plVar4 + 0x28))(plVar4);
      iVar1 = **(int **)(*(long *)(lVar3 + 0xc0) + 8);
      lVar3 = (**(code **)(*plVar5 + 400))(plVar5);
      iVar2 = (**(code **)(*(long *)(lVar3 + 0x20) + 0x38))(lVar3 + 0x20);
      if (iVar2 != 0x12) {
        plVar5 = (long *)(**(code **)(*plVar5 + 400))(plVar5);
        this_00 = (TType *)(**(code **)(*plVar5 + 0xf0))(plVar5);
        pTVar6 = TType::getStruct(this_00);
        if (iVar1 == (int)((ulong)((long)(pTVar6->
                                         super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                         ).
                                         super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pTVar6->
                                        super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                        ).
                                        super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 5) + -1) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool TParseContext::isRuntimeLength(const TIntermTyped& base) const
{
    if (base.getType().getQualifier().storage == EvqBuffer) {
        // in a buffer block
        const TIntermBinary* binary = base.getAsBinaryNode();
        if (binary != nullptr && binary->getOp() == EOpIndexDirectStruct) {
            // is it the last member?
            const int index = binary->getRight()->getAsConstantUnion()->getConstArray()[0].getIConst();

            if (binary->getLeft()->isReference())
                return false;

            const int memberCount = (int)binary->getLeft()->getType().getStruct()->size();
            if (index == memberCount - 1)
                return true;
        }
    }

    return false;
}